

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O2

void blockmix_salsa8(salsa20_blk_t *Bin,salsa20_blk_t *Bout,size_t r)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  size_t sVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  long lVar6;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar19;
  int iVar20;
  __m128i Y0;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar21;
  uint uVar22;
  uint uVar31;
  uint uVar32;
  __m128i Y1;
  uint uVar33;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i Y3;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar59;
  int iVar60;
  __m128i Y2;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar61;
  undefined1 auVar58 [16];
  uint uVar62;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  __m128i Y0_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar79;
  uint uVar80;
  uint uVar81;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  uint uVar149;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint uVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  
  lVar1 = r - 1;
  lVar6 = lVar1;
  do {
    bVar7 = lVar6 != 0;
    lVar6 = lVar6 + -1;
  } while (bVar7);
  uVar9 = Bin[lVar1 * 2 + 1].w[0];
  uVar75 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x44);
  uVar77 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x48);
  uVar79 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x4c);
  uVar22 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x50);
  uVar31 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x54);
  uVar32 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x58);
  uVar33 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x5c);
  auVar47 = *(undefined1 (*) [16])((long)Bin + lVar1 * 0x80 + 0x60);
  auVar34 = *(undefined1 (*) [16])((long)Bin + lVar1 * 0x80 + 0x70);
  pauVar5 = (undefined1 (*) [16])((long)Bin + 0x70);
  pauVar4 = (undefined1 (*) [16])(Bout->w + 0xc);
  sVar3 = r;
  while (bVar7 = sVar3 != 0, sVar3 = sVar3 - 1, bVar7) {
    uVar62 = uVar9 ^ *(uint *)pauVar5[-7];
    uVar75 = uVar75 ^ *(uint *)(pauVar5[-7] + 4);
    uVar77 = uVar77 ^ *(uint *)(pauVar5[-7] + 8);
    uVar79 = uVar79 ^ *(uint *)(pauVar5[-7] + 0xc);
    uVar22 = uVar22 ^ *(uint *)pauVar5[-6];
    uVar31 = uVar31 ^ *(uint *)(pauVar5[-6] + 4);
    uVar32 = uVar32 ^ *(uint *)(pauVar5[-6] + 8);
    uVar33 = uVar33 ^ *(uint *)(pauVar5[-6] + 0xc);
    auVar47 = auVar47 ^ pauVar5[-5];
    auVar34 = auVar34 ^ pauVar5[-4];
    uVar80 = auVar34._0_4_ + uVar62;
    uVar90 = auVar34._4_4_ + uVar75;
    uVar92 = auVar34._8_4_ + uVar77;
    uVar94 = auVar34._12_4_ + uVar79;
    uVar95 = (uVar80 * 0x80 | uVar80 >> 0x19) ^ uVar22;
    uVar81 = (uVar90 * 0x80 | uVar90 >> 0x19) ^ uVar31;
    uVar91 = (uVar92 * 0x80 | uVar92 >> 0x19) ^ uVar32;
    uVar93 = (uVar94 * 0x80 | uVar94 >> 0x19) ^ uVar33;
    auVar63._0_4_ = uVar95 + uVar62 >> 0x17;
    auVar63._4_4_ = uVar81 + uVar75 >> 0x17;
    auVar63._8_4_ = uVar91 + uVar77 >> 0x17;
    auVar63._12_4_ = uVar93 + uVar79 >> 0x17;
    auVar96._0_4_ = (uVar95 + uVar62) * 0x200;
    auVar96._4_4_ = (uVar81 + uVar75) * 0x200;
    auVar96._8_4_ = (uVar91 + uVar77) * 0x200;
    auVar96._12_4_ = (uVar93 + uVar79) * 0x200;
    auVar97 = (auVar96 | auVar63) ^ auVar47;
    iVar8 = auVar97._0_4_;
    iVar19 = auVar97._4_4_;
    uVar80 = auVar97._8_4_ + uVar91;
    uVar90 = auVar97._12_4_ + uVar93;
    auVar109._0_4_ = iVar8 + uVar95 >> 0x13;
    auVar109._4_4_ = iVar19 + uVar81 >> 0x13;
    auVar109._8_4_ = uVar80 >> 0x13;
    auVar109._12_4_ = uVar90 >> 0x13;
    auVar64._0_4_ = (iVar8 + uVar95) * 0x2000;
    auVar64._4_4_ = (iVar19 + uVar81) * 0x2000;
    auVar64._8_4_ = uVar80 * 0x2000;
    auVar64._12_4_ = uVar90 * 0x2000;
    auVar65 = (auVar64 | auVar109) ^ auVar34;
    auVar110._0_12_ = auVar65._4_12_;
    auVar110._12_4_ = auVar65._0_4_;
    uVar80 = auVar65._0_4_ + iVar8;
    uVar92 = auVar65._4_4_ + iVar19;
    uVar76 = auVar65._8_4_ + auVar97._8_4_;
    uVar78 = auVar65._12_4_ + auVar97._12_4_;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar62;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar75;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar77;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar79;
    auVar84._4_4_ = uVar95;
    auVar84._0_4_ = uVar93;
    auVar84._8_4_ = uVar81;
    auVar84._12_4_ = uVar91;
    auVar82._0_8_ = auVar97._8_8_;
    auVar82._8_4_ = iVar8;
    auVar82._12_4_ = iVar19;
    auVar151._0_4_ = (uVar93 + uVar90) * 0x80;
    auVar151._4_4_ = (uVar95 + uVar94) * 0x80;
    auVar151._8_4_ = (uVar81 + uVar149) * 0x80;
    auVar151._12_4_ = (uVar91 + uVar150) * 0x80;
    auVar98._0_4_ = uVar93 + uVar90 >> 0x19;
    auVar98._4_4_ = uVar95 + uVar94 >> 0x19;
    auVar98._8_4_ = uVar81 + uVar149 >> 0x19;
    auVar98._12_4_ = uVar91 + uVar150 >> 0x19;
    auVar98 = auVar98 ^ auVar151 ^ auVar110;
    iVar20 = auVar98._0_4_;
    iVar21 = auVar98._4_4_;
    iVar46 = auVar98._8_4_;
    iVar59 = auVar98._12_4_;
    auVar152._0_4_ = (iVar20 + uVar90) * 0x200;
    auVar152._4_4_ = (iVar21 + uVar94) * 0x200;
    auVar152._8_4_ = (iVar46 + uVar149) * 0x200;
    auVar152._12_4_ = (iVar59 + uVar150) * 0x200;
    auVar111._0_4_ = iVar20 + uVar90 >> 0x17;
    auVar111._4_4_ = iVar21 + uVar94 >> 0x17;
    auVar111._8_4_ = iVar46 + uVar149 >> 0x17;
    auVar111._12_4_ = iVar59 + uVar150 >> 0x17;
    auVar111 = auVar111 ^ auVar152 ^ auVar82;
    iVar8 = auVar111._0_4_;
    iVar19 = auVar111._4_4_;
    uVar80 = auVar111._8_4_ + iVar46;
    uVar92 = auVar111._12_4_ + iVar59;
    auVar153._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar153._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar153._8_4_ = uVar80 >> 0x13;
    auVar153._12_4_ = uVar92 >> 0x13;
    auVar83._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar83._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar83._8_4_ = uVar80 * 0x2000;
    auVar83._12_4_ = uVar92 * 0x2000;
    auVar84 = (auVar83 | auVar153) ^ auVar84;
    auVar121._0_12_ = auVar84._4_12_;
    auVar121._12_4_ = auVar84._0_4_;
    uVar80 = auVar84._0_4_ + iVar8;
    uVar92 = auVar84._4_4_ + iVar19;
    uVar76 = auVar84._8_4_ + auVar111._8_4_;
    uVar78 = auVar84._12_4_ + auVar111._12_4_;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150;
    auVar66._0_8_ = auVar111._8_8_;
    auVar66._8_4_ = iVar8;
    auVar66._12_4_ = iVar19;
    auVar68._4_4_ = iVar20;
    auVar68._0_4_ = iVar59;
    auVar68._8_4_ = iVar21;
    auVar68._12_4_ = iVar46;
    auVar154._0_4_ = (iVar59 + uVar90) * 0x80;
    auVar154._4_4_ = (iVar20 + uVar94) * 0x80;
    auVar154._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar154._12_4_ = (iVar46 + uVar150) * 0x80;
    auVar99._0_4_ = iVar59 + uVar90 >> 0x19;
    auVar99._4_4_ = iVar20 + uVar94 >> 0x19;
    auVar99._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar99._12_4_ = iVar46 + uVar150 >> 0x19;
    auVar99 = auVar99 ^ auVar154 ^ auVar121;
    iVar20 = auVar99._0_4_;
    iVar21 = auVar99._4_4_;
    iVar46 = auVar99._8_4_;
    iVar59 = auVar99._12_4_;
    auVar155._0_4_ = (iVar20 + uVar90) * 0x200;
    auVar155._4_4_ = (iVar21 + uVar94) * 0x200;
    auVar155._8_4_ = (iVar46 + uVar149) * 0x200;
    auVar155._12_4_ = (iVar59 + uVar150) * 0x200;
    auVar122._0_4_ = iVar20 + uVar90 >> 0x17;
    auVar122._4_4_ = iVar21 + uVar94 >> 0x17;
    auVar122._8_4_ = iVar46 + uVar149 >> 0x17;
    auVar122._12_4_ = iVar59 + uVar150 >> 0x17;
    auVar122 = auVar122 ^ auVar155 ^ auVar66;
    iVar8 = auVar122._0_4_;
    iVar19 = auVar122._4_4_;
    uVar80 = auVar122._8_4_ + iVar46;
    uVar92 = auVar122._12_4_ + iVar59;
    auVar156._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar156._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar156._8_4_ = uVar80 >> 0x13;
    auVar156._12_4_ = uVar92 >> 0x13;
    auVar67._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar67._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar67._8_4_ = uVar80 * 0x2000;
    auVar67._12_4_ = uVar92 * 0x2000;
    auVar68 = (auVar67 | auVar156) ^ auVar68;
    auVar112._0_12_ = auVar68._4_12_;
    auVar112._12_4_ = auVar68._0_4_;
    uVar80 = auVar68._0_4_ + iVar8;
    uVar92 = auVar68._4_4_ + iVar19;
    uVar76 = auVar68._8_4_ + auVar122._8_4_;
    uVar78 = auVar68._12_4_ + auVar122._12_4_;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150;
    auVar87._4_4_ = iVar20;
    auVar87._0_4_ = iVar59;
    auVar87._8_4_ = iVar21;
    auVar87._12_4_ = iVar46;
    auVar85._0_8_ = auVar122._8_8_;
    auVar85._8_4_ = iVar8;
    auVar85._12_4_ = iVar19;
    auVar123._0_4_ = (iVar59 + uVar90) * 0x80;
    auVar123._4_4_ = (iVar20 + uVar94) * 0x80;
    auVar123._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar123._12_4_ = (iVar46 + uVar150) * 0x80;
    auVar100._0_4_ = iVar59 + uVar90 >> 0x19;
    auVar100._4_4_ = iVar20 + uVar94 >> 0x19;
    auVar100._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar100._12_4_ = iVar46 + uVar150 >> 0x19;
    auVar100 = auVar100 ^ auVar123 ^ auVar112;
    iVar20 = auVar100._0_4_;
    iVar21 = auVar100._4_4_;
    iVar46 = auVar100._8_4_;
    iVar59 = auVar100._12_4_;
    auVar124._0_4_ = (iVar20 + uVar90) * 0x200;
    auVar124._4_4_ = (iVar21 + uVar94) * 0x200;
    auVar124._8_4_ = (iVar46 + uVar149) * 0x200;
    auVar124._12_4_ = (iVar59 + uVar150) * 0x200;
    auVar113._0_4_ = iVar20 + uVar90 >> 0x17;
    auVar113._4_4_ = iVar21 + uVar94 >> 0x17;
    auVar113._8_4_ = iVar46 + uVar149 >> 0x17;
    auVar113._12_4_ = iVar59 + uVar150 >> 0x17;
    auVar113 = auVar113 ^ auVar124 ^ auVar85;
    iVar8 = auVar113._0_4_;
    iVar19 = auVar113._4_4_;
    uVar80 = auVar113._8_4_ + iVar46;
    uVar92 = auVar113._12_4_ + iVar59;
    auVar125._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar125._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar125._8_4_ = uVar80 >> 0x13;
    auVar125._12_4_ = uVar92 >> 0x13;
    auVar86._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar86._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar86._8_4_ = uVar80 * 0x2000;
    auVar86._12_4_ = uVar92 * 0x2000;
    auVar87 = (auVar86 | auVar125) ^ auVar87;
    auVar126._0_12_ = auVar87._4_12_;
    auVar126._12_4_ = auVar87._0_4_;
    uVar80 = auVar87._0_4_ + iVar8;
    uVar92 = auVar87._4_4_ + iVar19;
    uVar76 = auVar87._8_4_ + auVar113._8_4_;
    uVar78 = auVar87._12_4_ + auVar113._12_4_;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150;
    auVar114._0_8_ = auVar113._8_8_;
    auVar114._8_4_ = iVar8;
    auVar114._12_4_ = iVar19;
    auVar104._4_4_ = iVar20;
    auVar104._0_4_ = iVar59;
    auVar104._8_4_ = iVar21;
    auVar104._12_4_ = iVar46;
    auVar101._0_4_ = (iVar59 + uVar90) * 0x80;
    auVar101._4_4_ = (iVar20 + uVar94) * 0x80;
    auVar101._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar101._12_4_ = (iVar46 + uVar150) * 0x80;
    auVar69._0_4_ = iVar59 + uVar90 >> 0x19;
    auVar69._4_4_ = iVar20 + uVar94 >> 0x19;
    auVar69._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar69._12_4_ = iVar46 + uVar150 >> 0x19;
    auVar69 = auVar69 ^ auVar101 ^ auVar126;
    iVar20 = auVar69._0_4_;
    iVar21 = auVar69._4_4_;
    iVar46 = auVar69._8_4_;
    iVar59 = auVar69._12_4_;
    auVar102._0_4_ = (iVar20 + uVar90) * 0x200;
    auVar102._4_4_ = (iVar21 + uVar94) * 0x200;
    auVar102._8_4_ = (iVar46 + uVar149) * 0x200;
    auVar102._12_4_ = (iVar59 + uVar150) * 0x200;
    auVar127._0_4_ = iVar20 + uVar90 >> 0x17;
    auVar127._4_4_ = iVar21 + uVar94 >> 0x17;
    auVar127._8_4_ = iVar46 + uVar149 >> 0x17;
    auVar127._12_4_ = iVar59 + uVar150 >> 0x17;
    auVar127 = auVar127 ^ auVar102 ^ auVar114;
    iVar8 = auVar127._0_4_;
    iVar19 = auVar127._4_4_;
    uVar80 = auVar127._8_4_ + iVar46;
    uVar92 = auVar127._12_4_ + iVar59;
    auVar115._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar115._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar115._8_4_ = uVar80 >> 0x13;
    auVar115._12_4_ = uVar92 >> 0x13;
    auVar103._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar103._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar103._8_4_ = uVar80 * 0x2000;
    auVar103._12_4_ = uVar92 * 0x2000;
    auVar104 = (auVar103 | auVar115) ^ auVar104;
    auVar116._0_12_ = auVar104._4_12_;
    auVar116._12_4_ = auVar104._0_4_;
    uVar80 = auVar104._0_4_ + iVar8;
    uVar92 = auVar104._4_4_ + iVar19;
    uVar76 = auVar104._8_4_ + auVar127._8_4_;
    uVar78 = auVar104._12_4_ + auVar127._12_4_;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150;
    auVar72._4_4_ = iVar20;
    auVar72._0_4_ = iVar59;
    auVar72._8_4_ = iVar21;
    auVar72._12_4_ = iVar46;
    auVar70._0_8_ = auVar127._8_8_;
    auVar70._8_4_ = iVar8;
    auVar70._12_4_ = iVar19;
    auVar128._0_4_ = (iVar59 + uVar90) * 0x80;
    auVar128._4_4_ = (iVar20 + uVar94) * 0x80;
    auVar128._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar128._12_4_ = (iVar46 + uVar150) * 0x80;
    auVar88._0_4_ = iVar59 + uVar90 >> 0x19;
    auVar88._4_4_ = iVar20 + uVar94 >> 0x19;
    auVar88._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar88._12_4_ = iVar46 + uVar150 >> 0x19;
    auVar88 = auVar88 ^ auVar128 ^ auVar116;
    iVar20 = auVar88._0_4_;
    iVar21 = auVar88._4_4_;
    iVar46 = auVar88._8_4_;
    iVar59 = auVar88._12_4_;
    auVar129._0_4_ = (iVar20 + uVar90) * 0x200;
    auVar129._4_4_ = (iVar21 + uVar94) * 0x200;
    auVar129._8_4_ = (iVar46 + uVar149) * 0x200;
    auVar129._12_4_ = (iVar59 + uVar150) * 0x200;
    auVar117._0_4_ = iVar20 + uVar90 >> 0x17;
    auVar117._4_4_ = iVar21 + uVar94 >> 0x17;
    auVar117._8_4_ = iVar46 + uVar149 >> 0x17;
    auVar117._12_4_ = iVar59 + uVar150 >> 0x17;
    auVar117 = auVar117 ^ auVar129 ^ auVar70;
    iVar8 = auVar117._0_4_;
    iVar19 = auVar117._4_4_;
    uVar80 = auVar117._8_4_ + iVar46;
    uVar92 = auVar117._12_4_ + iVar59;
    auVar130._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar130._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar130._8_4_ = uVar80 >> 0x13;
    auVar130._12_4_ = uVar92 >> 0x13;
    auVar71._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar71._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar71._8_4_ = uVar80 * 0x2000;
    auVar71._12_4_ = uVar92 * 0x2000;
    auVar72 = (auVar71 | auVar130) ^ auVar72;
    auVar131._0_12_ = auVar72._4_12_;
    auVar131._12_4_ = auVar72._0_4_;
    uVar80 = auVar72._0_4_ + iVar8;
    uVar92 = auVar72._4_4_ + iVar19;
    uVar76 = auVar72._8_4_ + auVar117._8_4_;
    uVar78 = auVar72._12_4_ + auVar117._12_4_;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150;
    auVar105._0_8_ = auVar117._8_8_;
    auVar105._8_4_ = iVar8;
    auVar105._12_4_ = iVar19;
    auVar134._4_4_ = iVar20;
    auVar134._0_4_ = iVar59;
    auVar134._8_4_ = iVar21;
    auVar134._12_4_ = iVar46;
    auVar157._0_4_ = (iVar59 + uVar90) * 0x80;
    auVar157._4_4_ = (iVar20 + uVar94) * 0x80;
    auVar157._8_4_ = (iVar21 + uVar149) * 0x80;
    auVar157._12_4_ = (iVar46 + uVar150) * 0x80;
    auVar89._0_4_ = iVar59 + uVar90 >> 0x19;
    auVar89._4_4_ = iVar20 + uVar94 >> 0x19;
    auVar89._8_4_ = iVar21 + uVar149 >> 0x19;
    auVar89._12_4_ = iVar46 + uVar150 >> 0x19;
    auVar89 = auVar89 ^ auVar157 ^ auVar131;
    uVar81 = auVar89._0_4_;
    uVar91 = auVar89._4_4_;
    uVar93 = auVar89._8_4_;
    uVar95 = auVar89._12_4_;
    auVar132._0_4_ = (uVar81 + uVar90) * 0x200;
    auVar132._4_4_ = (uVar91 + uVar94) * 0x200;
    auVar132._8_4_ = (uVar93 + uVar149) * 0x200;
    auVar132._12_4_ = (uVar95 + uVar150) * 0x200;
    auVar158._0_4_ = uVar81 + uVar90 >> 0x17;
    auVar158._4_4_ = uVar91 + uVar94 >> 0x17;
    auVar158._8_4_ = uVar93 + uVar149 >> 0x17;
    auVar158._12_4_ = uVar95 + uVar150 >> 0x17;
    auVar158 = auVar158 ^ auVar132 ^ auVar105;
    iVar8 = auVar158._0_4_;
    iVar19 = auVar158._4_4_;
    uVar80 = auVar158._8_4_ + uVar93;
    uVar92 = auVar158._12_4_ + uVar95;
    auVar106._0_4_ = iVar8 + uVar81 >> 0x13;
    auVar106._4_4_ = iVar19 + uVar91 >> 0x13;
    auVar106._8_4_ = uVar80 >> 0x13;
    auVar106._12_4_ = uVar92 >> 0x13;
    auVar133._0_4_ = (iVar8 + uVar81) * 0x2000;
    auVar133._4_4_ = (iVar19 + uVar91) * 0x2000;
    auVar133._8_4_ = uVar80 * 0x2000;
    auVar133._12_4_ = uVar92 * 0x2000;
    auVar134 = (auVar133 | auVar106) ^ auVar134;
    auVar118._0_12_ = auVar134._4_12_;
    auVar118._12_4_ = auVar134._0_4_;
    uVar80 = auVar134._0_4_ + iVar8;
    uVar92 = auVar134._4_4_ + iVar19;
    uVar76 = auVar134._8_4_ + auVar158._8_4_;
    uVar78 = auVar134._12_4_ + auVar158._12_4_;
    auVar159._0_8_ = auVar158._8_8_;
    auVar159._8_4_ = iVar8;
    auVar159._12_4_ = iVar19;
    uVar90 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90;
    uVar94 = (uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94;
    uVar149 = (uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149;
    uVar150 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150;
    auVar73._0_4_ = (uVar95 + uVar90) * 0x80;
    auVar73._4_4_ = (uVar81 + uVar94) * 0x80;
    auVar73._8_4_ = (uVar91 + uVar149) * 0x80;
    auVar73._12_4_ = (uVar93 + uVar150) * 0x80;
    auVar107._0_4_ = uVar95 + uVar90 >> 0x19;
    auVar107._4_4_ = uVar81 + uVar94 >> 0x19;
    auVar107._8_4_ = uVar91 + uVar149 >> 0x19;
    auVar107._12_4_ = uVar93 + uVar150 >> 0x19;
    auVar107 = auVar107 ^ auVar73 ^ auVar118;
    iVar46 = auVar107._0_4_;
    iVar59 = auVar107._4_4_;
    iVar60 = auVar107._8_4_;
    iVar61 = auVar107._12_4_;
    auVar74._0_4_ = (iVar46 + uVar90) * 0x200;
    auVar74._4_4_ = (iVar59 + uVar94) * 0x200;
    auVar74._8_4_ = (iVar60 + uVar149) * 0x200;
    auVar74._12_4_ = (iVar61 + uVar150) * 0x200;
    auVar119._0_4_ = iVar46 + uVar90 >> 0x17;
    auVar119._4_4_ = iVar59 + uVar94 >> 0x17;
    auVar119._8_4_ = iVar60 + uVar149 >> 0x17;
    auVar119._12_4_ = iVar61 + uVar150 >> 0x17;
    auVar119 = auVar119 ^ auVar74 ^ auVar159;
    iVar8 = auVar119._0_4_;
    iVar19 = auVar119._4_4_;
    iVar20 = auVar119._8_4_;
    iVar21 = auVar119._12_4_;
    uVar95 = ((iVar8 + iVar46) * 0x2000 | (uint)(iVar8 + iVar46) >> 0x13) ^ uVar95;
    uVar81 = ((iVar19 + iVar59) * 0x2000 | (uint)(iVar19 + iVar59) >> 0x13) ^ uVar81;
    uVar91 = ((iVar20 + iVar60) * 0x2000 | (uint)(iVar20 + iVar60) >> 0x13) ^ uVar91;
    uVar93 = ((iVar21 + iVar61) * 0x2000 | (uint)(iVar21 + iVar61) >> 0x13) ^ uVar93;
    uVar80 = uVar95 + iVar8;
    uVar92 = uVar81 + iVar19;
    uVar76 = uVar91 + iVar20;
    uVar78 = uVar93 + iVar21;
    uVar62 = ((uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar90) + uVar62;
    uVar75 = ((uVar92 * 0x40000 | uVar92 >> 0xe) ^ uVar94) + uVar75;
    uVar77 = ((uVar76 * 0x40000 | uVar76 >> 0xe) ^ uVar149) + uVar77;
    uVar79 = ((uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar150) + uVar79;
    *(uint *)pauVar4[-3] = uVar62;
    *(uint *)((long)pauVar4[-3] + 4) = uVar75;
    *(uint *)((long)pauVar4[-3] + 8) = uVar77;
    *(uint *)((long)pauVar4[-3] + 0xc) = uVar79;
    uVar81 = uVar81 + uVar22;
    uVar91 = uVar91 + uVar31;
    uVar93 = uVar93 + uVar32;
    uVar95 = uVar95 + uVar33;
    *(uint *)pauVar4[-2] = uVar81;
    *(uint *)((long)pauVar4[-2] + 4) = uVar91;
    *(uint *)((long)pauVar4[-2] + 8) = uVar93;
    *(uint *)((long)pauVar4[-2] + 0xc) = uVar95;
    auVar120._0_4_ = iVar20 + auVar47._0_4_;
    auVar120._4_4_ = iVar21 + auVar47._4_4_;
    auVar120._8_4_ = iVar8 + auVar47._8_4_;
    auVar120._12_4_ = iVar19 + auVar47._12_4_;
    pauVar4[-1] = auVar120;
    auVar108._0_4_ = iVar61 + auVar34._0_4_;
    auVar108._4_4_ = iVar46 + auVar34._4_4_;
    auVar108._8_4_ = iVar59 + auVar34._8_4_;
    auVar108._12_4_ = iVar60 + auVar34._12_4_;
    *pauVar4 = auVar108;
    uVar62 = uVar62 ^ *(uint *)pauVar5[-3];
    uVar75 = uVar75 ^ *(uint *)(pauVar5[-3] + 4);
    uVar77 = uVar77 ^ *(uint *)(pauVar5[-3] + 8);
    uVar79 = uVar79 ^ *(uint *)(pauVar5[-3] + 0xc);
    auVar108 = auVar108 ^ *pauVar5;
    uVar22 = auVar108._0_4_ + uVar62;
    uVar31 = auVar108._4_4_ + uVar75;
    uVar32 = auVar108._8_4_ + uVar77;
    uVar33 = auVar108._12_4_ + uVar79;
    uVar81 = uVar81 ^ *(uint *)pauVar5[-2];
    uVar91 = uVar91 ^ *(uint *)(pauVar5[-2] + 4);
    uVar93 = uVar93 ^ *(uint *)(pauVar5[-2] + 8);
    uVar95 = uVar95 ^ *(uint *)(pauVar5[-2] + 0xc);
    uVar90 = (uVar22 * 0x80 | uVar22 >> 0x19) ^ uVar81;
    uVar94 = (uVar31 * 0x80 | uVar31 >> 0x19) ^ uVar91;
    uVar149 = (uVar32 * 0x80 | uVar32 >> 0x19) ^ uVar93;
    uVar150 = (uVar33 * 0x80 | uVar33 >> 0x19) ^ uVar95;
    auVar65._0_4_ = uVar90 + uVar62 >> 0x17;
    auVar65._4_4_ = uVar94 + uVar75 >> 0x17;
    auVar65._8_4_ = uVar149 + uVar77 >> 0x17;
    auVar65._12_4_ = uVar150 + uVar79 >> 0x17;
    auVar35._0_4_ = (uVar90 + uVar62) * 0x200;
    auVar35._4_4_ = (uVar94 + uVar75) * 0x200;
    auVar35._8_4_ = (uVar149 + uVar77) * 0x200;
    auVar35._12_4_ = (uVar150 + uVar79) * 0x200;
    auVar120 = auVar120 ^ pauVar5[-1];
    auVar34 = (auVar35 | auVar65) ^ auVar120;
    iVar8 = auVar34._0_4_;
    iVar19 = auVar34._4_4_;
    uVar22 = auVar34._8_4_ + uVar149;
    uVar31 = auVar34._12_4_ + uVar150;
    auVar48._0_4_ = iVar8 + uVar90 >> 0x13;
    auVar48._4_4_ = iVar19 + uVar94 >> 0x13;
    auVar48._8_4_ = uVar22 >> 0x13;
    auVar48._12_4_ = uVar31 >> 0x13;
    auVar97._0_4_ = (iVar8 + uVar90) * 0x2000;
    auVar97._4_4_ = (iVar19 + uVar94) * 0x2000;
    auVar97._8_4_ = uVar22 * 0x2000;
    auVar97._12_4_ = uVar31 * 0x2000;
    auVar47 = (auVar97 | auVar48) ^ auVar108;
    auVar49._0_12_ = auVar47._4_12_;
    auVar49._12_4_ = auVar47._0_4_;
    uVar22 = auVar47._0_4_ + iVar8;
    uVar31 = auVar47._4_4_ + iVar19;
    uVar32 = auVar47._8_4_ + auVar34._8_4_;
    uVar33 = auVar47._12_4_ + auVar34._12_4_;
    uVar80 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar62;
    uVar92 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar75;
    uVar76 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar77;
    uVar78 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar79;
    auVar25._4_4_ = uVar90;
    auVar25._0_4_ = uVar150;
    auVar25._8_4_ = uVar94;
    auVar25._12_4_ = uVar149;
    auVar23._0_8_ = auVar34._8_8_;
    auVar23._8_4_ = iVar8;
    auVar23._12_4_ = iVar19;
    auVar160._0_4_ = (uVar150 + uVar80) * 0x80;
    auVar160._4_4_ = (uVar90 + uVar92) * 0x80;
    auVar160._8_4_ = (uVar94 + uVar76) * 0x80;
    auVar160._12_4_ = (uVar149 + uVar78) * 0x80;
    auVar36._0_4_ = uVar150 + uVar80 >> 0x19;
    auVar36._4_4_ = uVar90 + uVar92 >> 0x19;
    auVar36._8_4_ = uVar94 + uVar76 >> 0x19;
    auVar36._12_4_ = uVar149 + uVar78 >> 0x19;
    auVar36 = auVar36 ^ auVar160 ^ auVar49;
    iVar20 = auVar36._0_4_;
    iVar21 = auVar36._4_4_;
    iVar46 = auVar36._8_4_;
    iVar59 = auVar36._12_4_;
    auVar161._0_4_ = (iVar20 + uVar80) * 0x200;
    auVar161._4_4_ = (iVar21 + uVar92) * 0x200;
    auVar161._8_4_ = (iVar46 + uVar76) * 0x200;
    auVar161._12_4_ = (iVar59 + uVar78) * 0x200;
    auVar50._0_4_ = iVar20 + uVar80 >> 0x17;
    auVar50._4_4_ = iVar21 + uVar92 >> 0x17;
    auVar50._8_4_ = iVar46 + uVar76 >> 0x17;
    auVar50._12_4_ = iVar59 + uVar78 >> 0x17;
    auVar50 = auVar50 ^ auVar161 ^ auVar23;
    iVar8 = auVar50._0_4_;
    iVar19 = auVar50._4_4_;
    uVar22 = auVar50._8_4_ + iVar46;
    uVar31 = auVar50._12_4_ + iVar59;
    auVar162._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar162._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar162._8_4_ = uVar22 >> 0x13;
    auVar162._12_4_ = uVar31 >> 0x13;
    auVar24._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar24._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar24._8_4_ = uVar22 * 0x2000;
    auVar24._12_4_ = uVar31 * 0x2000;
    auVar25 = (auVar24 | auVar162) ^ auVar25;
    auVar135._0_12_ = auVar25._4_12_;
    auVar135._12_4_ = auVar25._0_4_;
    uVar22 = auVar25._0_4_ + iVar8;
    uVar31 = auVar25._4_4_ + iVar19;
    uVar32 = auVar25._8_4_ + auVar50._8_4_;
    uVar33 = auVar25._12_4_ + auVar50._12_4_;
    uVar80 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar80;
    uVar92 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar92;
    uVar76 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar76;
    uVar78 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar78;
    auVar10._0_8_ = auVar50._8_8_;
    auVar10._8_4_ = iVar8;
    auVar10._12_4_ = iVar19;
    auVar12._4_4_ = iVar20;
    auVar12._0_4_ = iVar59;
    auVar12._8_4_ = iVar21;
    auVar12._12_4_ = iVar46;
    auVar163._0_4_ = (iVar59 + uVar80) * 0x80;
    auVar163._4_4_ = (iVar20 + uVar92) * 0x80;
    auVar163._8_4_ = (iVar21 + uVar76) * 0x80;
    auVar163._12_4_ = (iVar46 + uVar78) * 0x80;
    auVar37._0_4_ = iVar59 + uVar80 >> 0x19;
    auVar37._4_4_ = iVar20 + uVar92 >> 0x19;
    auVar37._8_4_ = iVar21 + uVar76 >> 0x19;
    auVar37._12_4_ = iVar46 + uVar78 >> 0x19;
    auVar37 = auVar37 ^ auVar163 ^ auVar135;
    iVar20 = auVar37._0_4_;
    iVar21 = auVar37._4_4_;
    iVar46 = auVar37._8_4_;
    iVar59 = auVar37._12_4_;
    auVar164._0_4_ = (iVar20 + uVar80) * 0x200;
    auVar164._4_4_ = (iVar21 + uVar92) * 0x200;
    auVar164._8_4_ = (iVar46 + uVar76) * 0x200;
    auVar164._12_4_ = (iVar59 + uVar78) * 0x200;
    auVar136._0_4_ = iVar20 + uVar80 >> 0x17;
    auVar136._4_4_ = iVar21 + uVar92 >> 0x17;
    auVar136._8_4_ = iVar46 + uVar76 >> 0x17;
    auVar136._12_4_ = iVar59 + uVar78 >> 0x17;
    auVar136 = auVar136 ^ auVar164 ^ auVar10;
    iVar8 = auVar136._0_4_;
    iVar19 = auVar136._4_4_;
    uVar22 = auVar136._8_4_ + iVar46;
    uVar31 = auVar136._12_4_ + iVar59;
    auVar165._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar165._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar165._8_4_ = uVar22 >> 0x13;
    auVar165._12_4_ = uVar31 >> 0x13;
    auVar11._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar11._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar11._8_4_ = uVar22 * 0x2000;
    auVar11._12_4_ = uVar31 * 0x2000;
    auVar12 = (auVar11 | auVar165) ^ auVar12;
    auVar51._0_12_ = auVar12._4_12_;
    auVar51._12_4_ = auVar12._0_4_;
    uVar22 = auVar12._0_4_ + iVar8;
    uVar31 = auVar12._4_4_ + iVar19;
    uVar32 = auVar12._8_4_ + auVar136._8_4_;
    uVar33 = auVar12._12_4_ + auVar136._12_4_;
    uVar80 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar80;
    uVar92 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar92;
    uVar76 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar76;
    uVar78 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar78;
    auVar28._4_4_ = iVar20;
    auVar28._0_4_ = iVar59;
    auVar28._8_4_ = iVar21;
    auVar28._12_4_ = iVar46;
    auVar26._0_8_ = auVar136._8_8_;
    auVar26._8_4_ = iVar8;
    auVar26._12_4_ = iVar19;
    auVar137._0_4_ = (iVar59 + uVar80) * 0x80;
    auVar137._4_4_ = (iVar20 + uVar92) * 0x80;
    auVar137._8_4_ = (iVar21 + uVar76) * 0x80;
    auVar137._12_4_ = (iVar46 + uVar78) * 0x80;
    auVar38._0_4_ = iVar59 + uVar80 >> 0x19;
    auVar38._4_4_ = iVar20 + uVar92 >> 0x19;
    auVar38._8_4_ = iVar21 + uVar76 >> 0x19;
    auVar38._12_4_ = iVar46 + uVar78 >> 0x19;
    auVar38 = auVar38 ^ auVar137 ^ auVar51;
    iVar20 = auVar38._0_4_;
    iVar21 = auVar38._4_4_;
    iVar46 = auVar38._8_4_;
    iVar59 = auVar38._12_4_;
    auVar138._0_4_ = (iVar20 + uVar80) * 0x200;
    auVar138._4_4_ = (iVar21 + uVar92) * 0x200;
    auVar138._8_4_ = (iVar46 + uVar76) * 0x200;
    auVar138._12_4_ = (iVar59 + uVar78) * 0x200;
    auVar52._0_4_ = iVar20 + uVar80 >> 0x17;
    auVar52._4_4_ = iVar21 + uVar92 >> 0x17;
    auVar52._8_4_ = iVar46 + uVar76 >> 0x17;
    auVar52._12_4_ = iVar59 + uVar78 >> 0x17;
    auVar52 = auVar52 ^ auVar138 ^ auVar26;
    iVar8 = auVar52._0_4_;
    iVar19 = auVar52._4_4_;
    uVar22 = auVar52._8_4_ + iVar46;
    uVar31 = auVar52._12_4_ + iVar59;
    auVar139._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar139._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar139._8_4_ = uVar22 >> 0x13;
    auVar139._12_4_ = uVar31 >> 0x13;
    auVar27._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar27._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar27._8_4_ = uVar22 * 0x2000;
    auVar27._12_4_ = uVar31 * 0x2000;
    auVar28 = (auVar27 | auVar139) ^ auVar28;
    auVar140._0_12_ = auVar28._4_12_;
    auVar140._12_4_ = auVar28._0_4_;
    uVar22 = auVar28._0_4_ + iVar8;
    uVar31 = auVar28._4_4_ + iVar19;
    uVar32 = auVar28._8_4_ + auVar52._8_4_;
    uVar33 = auVar28._12_4_ + auVar52._12_4_;
    uVar80 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar80;
    uVar92 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar92;
    uVar76 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar76;
    uVar78 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar78;
    auVar53._0_8_ = auVar52._8_8_;
    auVar53._8_4_ = iVar8;
    auVar53._12_4_ = iVar19;
    auVar42._4_4_ = iVar20;
    auVar42._0_4_ = iVar59;
    auVar42._8_4_ = iVar21;
    auVar42._12_4_ = iVar46;
    auVar39._0_4_ = (iVar59 + uVar80) * 0x80;
    auVar39._4_4_ = (iVar20 + uVar92) * 0x80;
    auVar39._8_4_ = (iVar21 + uVar76) * 0x80;
    auVar39._12_4_ = (iVar46 + uVar78) * 0x80;
    auVar13._0_4_ = iVar59 + uVar80 >> 0x19;
    auVar13._4_4_ = iVar20 + uVar92 >> 0x19;
    auVar13._8_4_ = iVar21 + uVar76 >> 0x19;
    auVar13._12_4_ = iVar46 + uVar78 >> 0x19;
    auVar13 = auVar13 ^ auVar39 ^ auVar140;
    iVar20 = auVar13._0_4_;
    iVar21 = auVar13._4_4_;
    iVar46 = auVar13._8_4_;
    iVar59 = auVar13._12_4_;
    auVar40._0_4_ = (iVar20 + uVar80) * 0x200;
    auVar40._4_4_ = (iVar21 + uVar92) * 0x200;
    auVar40._8_4_ = (iVar46 + uVar76) * 0x200;
    auVar40._12_4_ = (iVar59 + uVar78) * 0x200;
    auVar141._0_4_ = iVar20 + uVar80 >> 0x17;
    auVar141._4_4_ = iVar21 + uVar92 >> 0x17;
    auVar141._8_4_ = iVar46 + uVar76 >> 0x17;
    auVar141._12_4_ = iVar59 + uVar78 >> 0x17;
    auVar141 = auVar141 ^ auVar40 ^ auVar53;
    iVar8 = auVar141._0_4_;
    iVar19 = auVar141._4_4_;
    uVar22 = auVar141._8_4_ + iVar46;
    uVar31 = auVar141._12_4_ + iVar59;
    auVar54._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar54._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar54._8_4_ = uVar22 >> 0x13;
    auVar54._12_4_ = uVar31 >> 0x13;
    auVar41._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar41._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar41._8_4_ = uVar22 * 0x2000;
    auVar41._12_4_ = uVar31 * 0x2000;
    auVar42 = (auVar41 | auVar54) ^ auVar42;
    auVar55._0_12_ = auVar42._4_12_;
    auVar55._12_4_ = auVar42._0_4_;
    uVar22 = auVar42._0_4_ + iVar8;
    uVar31 = auVar42._4_4_ + iVar19;
    uVar32 = auVar42._8_4_ + auVar141._8_4_;
    uVar33 = auVar42._12_4_ + auVar141._12_4_;
    uVar80 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar80;
    uVar92 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar92;
    uVar76 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar76;
    uVar78 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar78;
    auVar16._4_4_ = iVar20;
    auVar16._0_4_ = iVar59;
    auVar16._8_4_ = iVar21;
    auVar16._12_4_ = iVar46;
    auVar14._0_8_ = auVar141._8_8_;
    auVar14._8_4_ = iVar8;
    auVar14._12_4_ = iVar19;
    auVar142._0_4_ = (iVar59 + uVar80) * 0x80;
    auVar142._4_4_ = (iVar20 + uVar92) * 0x80;
    auVar142._8_4_ = (iVar21 + uVar76) * 0x80;
    auVar142._12_4_ = (iVar46 + uVar78) * 0x80;
    auVar29._0_4_ = iVar59 + uVar80 >> 0x19;
    auVar29._4_4_ = iVar20 + uVar92 >> 0x19;
    auVar29._8_4_ = iVar21 + uVar76 >> 0x19;
    auVar29._12_4_ = iVar46 + uVar78 >> 0x19;
    auVar29 = auVar29 ^ auVar142 ^ auVar55;
    iVar20 = auVar29._0_4_;
    iVar21 = auVar29._4_4_;
    iVar46 = auVar29._8_4_;
    iVar59 = auVar29._12_4_;
    auVar143._0_4_ = (iVar20 + uVar80) * 0x200;
    auVar143._4_4_ = (iVar21 + uVar92) * 0x200;
    auVar143._8_4_ = (iVar46 + uVar76) * 0x200;
    auVar143._12_4_ = (iVar59 + uVar78) * 0x200;
    auVar56._0_4_ = iVar20 + uVar80 >> 0x17;
    auVar56._4_4_ = iVar21 + uVar92 >> 0x17;
    auVar56._8_4_ = iVar46 + uVar76 >> 0x17;
    auVar56._12_4_ = iVar59 + uVar78 >> 0x17;
    auVar56 = auVar56 ^ auVar143 ^ auVar14;
    iVar8 = auVar56._0_4_;
    iVar19 = auVar56._4_4_;
    uVar22 = auVar56._8_4_ + iVar46;
    uVar31 = auVar56._12_4_ + iVar59;
    auVar144._0_4_ = (uint)(iVar8 + iVar20) >> 0x13;
    auVar144._4_4_ = (uint)(iVar19 + iVar21) >> 0x13;
    auVar144._8_4_ = uVar22 >> 0x13;
    auVar144._12_4_ = uVar31 >> 0x13;
    auVar15._0_4_ = (iVar8 + iVar20) * 0x2000;
    auVar15._4_4_ = (iVar19 + iVar21) * 0x2000;
    auVar15._8_4_ = uVar22 * 0x2000;
    auVar15._12_4_ = uVar31 * 0x2000;
    auVar16 = (auVar15 | auVar144) ^ auVar16;
    auVar145._0_12_ = auVar16._4_12_;
    auVar145._12_4_ = auVar16._0_4_;
    uVar22 = auVar16._0_4_ + iVar8;
    uVar31 = auVar16._4_4_ + iVar19;
    uVar32 = auVar16._8_4_ + auVar56._8_4_;
    uVar33 = auVar16._12_4_ + auVar56._12_4_;
    uVar80 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar80;
    uVar92 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar92;
    uVar76 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar76;
    uVar78 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar78;
    auVar43._0_8_ = auVar56._8_8_;
    auVar43._8_4_ = iVar8;
    auVar43._12_4_ = iVar19;
    auVar148._4_4_ = iVar20;
    auVar148._0_4_ = iVar59;
    auVar148._8_4_ = iVar21;
    auVar148._12_4_ = iVar46;
    auVar166._0_4_ = (iVar59 + uVar80) * 0x80;
    auVar166._4_4_ = (iVar20 + uVar92) * 0x80;
    auVar166._8_4_ = (iVar21 + uVar76) * 0x80;
    auVar166._12_4_ = (iVar46 + uVar78) * 0x80;
    auVar30._0_4_ = iVar59 + uVar80 >> 0x19;
    auVar30._4_4_ = iVar20 + uVar92 >> 0x19;
    auVar30._8_4_ = iVar21 + uVar76 >> 0x19;
    auVar30._12_4_ = iVar46 + uVar78 >> 0x19;
    auVar30 = auVar30 ^ auVar166 ^ auVar145;
    uVar22 = auVar30._0_4_;
    uVar31 = auVar30._4_4_;
    uVar32 = auVar30._8_4_;
    uVar33 = auVar30._12_4_;
    auVar146._0_4_ = (uVar22 + uVar80) * 0x200;
    auVar146._4_4_ = (uVar31 + uVar92) * 0x200;
    auVar146._8_4_ = (uVar32 + uVar76) * 0x200;
    auVar146._12_4_ = (uVar33 + uVar78) * 0x200;
    auVar167._0_4_ = uVar22 + uVar80 >> 0x17;
    auVar167._4_4_ = uVar31 + uVar92 >> 0x17;
    auVar167._8_4_ = uVar32 + uVar76 >> 0x17;
    auVar167._12_4_ = uVar33 + uVar78 >> 0x17;
    auVar167 = auVar167 ^ auVar146 ^ auVar43;
    iVar8 = auVar167._0_4_;
    iVar19 = auVar167._4_4_;
    uVar90 = auVar167._8_4_ + uVar32;
    uVar94 = auVar167._12_4_ + uVar33;
    auVar44._0_4_ = iVar8 + uVar22 >> 0x13;
    auVar44._4_4_ = iVar19 + uVar31 >> 0x13;
    auVar44._8_4_ = uVar90 >> 0x13;
    auVar44._12_4_ = uVar94 >> 0x13;
    auVar147._0_4_ = (iVar8 + uVar22) * 0x2000;
    auVar147._4_4_ = (iVar19 + uVar31) * 0x2000;
    auVar147._8_4_ = uVar90 * 0x2000;
    auVar147._12_4_ = uVar94 * 0x2000;
    auVar148 = (auVar147 | auVar44) ^ auVar148;
    auVar57._0_12_ = auVar148._4_12_;
    auVar57._12_4_ = auVar148._0_4_;
    uVar90 = auVar148._0_4_ + iVar8;
    uVar94 = auVar148._4_4_ + iVar19;
    uVar149 = auVar148._8_4_ + auVar167._8_4_;
    uVar150 = auVar148._12_4_ + auVar167._12_4_;
    auVar168._0_8_ = auVar167._8_8_;
    auVar168._8_4_ = iVar8;
    auVar168._12_4_ = iVar19;
    uVar80 = (uVar90 * 0x40000 | uVar90 >> 0xe) ^ uVar80;
    uVar92 = (uVar94 * 0x40000 | uVar94 >> 0xe) ^ uVar92;
    uVar76 = (uVar149 * 0x40000 | uVar149 >> 0xe) ^ uVar76;
    uVar78 = (uVar150 * 0x40000 | uVar150 >> 0xe) ^ uVar78;
    auVar17._0_4_ = (uVar33 + uVar80) * 0x80;
    auVar17._4_4_ = (uVar22 + uVar92) * 0x80;
    auVar17._8_4_ = (uVar31 + uVar76) * 0x80;
    auVar17._12_4_ = (uVar32 + uVar78) * 0x80;
    auVar45._0_4_ = uVar33 + uVar80 >> 0x19;
    auVar45._4_4_ = uVar22 + uVar92 >> 0x19;
    auVar45._8_4_ = uVar31 + uVar76 >> 0x19;
    auVar45._12_4_ = uVar32 + uVar78 >> 0x19;
    auVar45 = auVar45 ^ auVar17 ^ auVar57;
    iVar46 = auVar45._0_4_;
    iVar59 = auVar45._4_4_;
    iVar60 = auVar45._8_4_;
    iVar61 = auVar45._12_4_;
    auVar18._0_4_ = (iVar46 + uVar80) * 0x200;
    auVar18._4_4_ = (iVar59 + uVar92) * 0x200;
    auVar18._8_4_ = (iVar60 + uVar76) * 0x200;
    auVar18._12_4_ = (iVar61 + uVar78) * 0x200;
    auVar58._0_4_ = iVar46 + uVar80 >> 0x17;
    auVar58._4_4_ = iVar59 + uVar92 >> 0x17;
    auVar58._8_4_ = iVar60 + uVar76 >> 0x17;
    auVar58._12_4_ = iVar61 + uVar78 >> 0x17;
    auVar58 = auVar58 ^ auVar18 ^ auVar168;
    iVar8 = auVar58._0_4_;
    iVar19 = auVar58._4_4_;
    iVar20 = auVar58._8_4_;
    iVar21 = auVar58._12_4_;
    uVar33 = ((iVar8 + iVar46) * 0x2000 | (uint)(iVar8 + iVar46) >> 0x13) ^ uVar33;
    uVar22 = ((iVar19 + iVar59) * 0x2000 | (uint)(iVar19 + iVar59) >> 0x13) ^ uVar22;
    uVar31 = ((iVar20 + iVar60) * 0x2000 | (uint)(iVar20 + iVar60) >> 0x13) ^ uVar31;
    uVar32 = ((iVar21 + iVar61) * 0x2000 | (uint)(iVar21 + iVar61) >> 0x13) ^ uVar32;
    uVar90 = uVar33 + iVar8;
    uVar94 = uVar22 + iVar19;
    uVar149 = uVar31 + iVar20;
    uVar150 = uVar32 + iVar21;
    uVar9 = ((uVar90 * 0x40000 | uVar90 >> 0xe) ^ uVar80) + uVar62;
    uVar75 = ((uVar94 * 0x40000 | uVar94 >> 0xe) ^ uVar92) + uVar75;
    uVar77 = ((uVar149 * 0x40000 | uVar149 >> 0xe) ^ uVar76) + uVar77;
    uVar79 = ((uVar150 * 0x40000 | uVar150 >> 0xe) ^ uVar78) + uVar79;
    pauVar2 = pauVar4 + r * 4 + -3;
    *(uint32_t *)*pauVar2 = uVar9;
    *(uint *)((long)*pauVar2 + 4) = uVar75;
    *(uint *)((long)*pauVar2 + 8) = uVar77;
    *(uint *)((long)*pauVar2 + 0xc) = uVar79;
    uVar22 = uVar22 + uVar81;
    uVar31 = uVar31 + uVar91;
    uVar32 = uVar32 + uVar93;
    uVar33 = uVar33 + uVar95;
    pauVar2 = pauVar4 + r * 4 + -2;
    *(uint *)*pauVar2 = uVar22;
    *(uint *)((long)*pauVar2 + 4) = uVar31;
    *(uint *)((long)*pauVar2 + 8) = uVar32;
    *(uint *)((long)*pauVar2 + 0xc) = uVar33;
    auVar47._0_4_ = iVar20 + auVar120._0_4_;
    auVar47._4_4_ = iVar21 + auVar120._4_4_;
    auVar47._8_4_ = iVar8 + auVar120._8_4_;
    auVar47._12_4_ = iVar19 + auVar120._12_4_;
    pauVar4[r * 4 + -1] = auVar47;
    auVar34._0_4_ = iVar61 + auVar108._0_4_;
    auVar34._4_4_ = iVar46 + auVar108._4_4_;
    auVar34._8_4_ = iVar59 + auVar108._8_4_;
    auVar34._12_4_ = iVar60 + auVar108._12_4_;
    pauVar4[r * 4] = auVar34;
    pauVar5 = pauVar5 + 8;
    pauVar4 = pauVar4 + 4;
  }
  return;
}

Assistant:

static void
blockmix_salsa8(const salsa20_blk_t *restrict Bin,
    salsa20_blk_t *restrict Bout, size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	X0 = Bin[r * 2 + 1].q[0];
	X1 = Bin[r * 2 + 1].q[1];
	X2 = Bin[r * 2 + 1].q[2];
	X3 = Bin[r * 2 + 1].q[3];

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2 + 1].q, Bout[r + 1 + i].q)
	}
}